

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotShaded<unsigned_short>
               (char *label_id,unsigned_short *values,int count,double y_ref,double xscale,double x0
               ,int offset,int stride)

{
  bool bVar1;
  GetterYs<unsigned_short> getter1;
  GetterYRef getter2;
  
  bVar1 = -INFINITY < y_ref;
  if (!bVar1) {
    GetPlotLimits((ImPlotLimits *)&getter1,-1);
    y_ref = getter1.XScale;
  }
  getter2.YRef = y_ref;
  if (y_ref >= INFINITY) {
    GetPlotLimits((ImPlotLimits *)&getter1,-1);
    getter2.YRef = getter1.X0;
  }
  if (count == 0) {
    getter1.Offset = 0;
  }
  else {
    getter1.Offset = (offset % count + count) % count;
  }
  getter1.Ys = values;
  getter1.Count = count;
  getter1.XScale = xscale;
  getter1.X0 = x0;
  getter1.Stride = stride;
  getter2.Count = count;
  getter2.XScale = xscale;
  getter2.X0 = x0;
  PlotShadedEx<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef>
            (label_id,&getter1,&getter2,y_ref < INFINITY && bVar1);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* values, int count, double y_ref, double xscale, double x0, int offset, int stride) {
    bool fit2 = true;
    if (y_ref == -HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Min;
    }
    if (y_ref == HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Max;
    }
    GetterYs<T> getter1(values,count,xscale,x0,offset,stride);
    GetterYRef getter2(y_ref,count,xscale,x0);
    PlotShadedEx(label_id, getter1, getter2, fit2);
}